

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_immutable_samplers
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *samplers,
          VkSampler **out_sampler)

{
  pointer __n;
  iterator iVar1;
  bool bVar2;
  SizeType SVar3;
  uint uVar4;
  VkSampler_T **ppVVar5;
  ConstValueIterator pGVar6;
  Ch *str;
  uchar *buffer_;
  size_type total_size;
  pointer ppVar7;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false> local_a0;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false> local_98;
  int local_90;
  allocator<unsigned_char> local_89;
  undefined1 local_88 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  size_t external_state_size;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false> local_60;
  iterator sampler_itr;
  uint64_t sampler_hash;
  ConstValueIterator itr;
  VkSampler_T **ret;
  VkSampler_T **samps;
  VkSampler **out_sampler_local;
  Value *samplers_local;
  DatabaseInterface *resolver_local;
  StateCreatorInterface *iface_local;
  Impl *this_local;
  
  SVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(samplers);
  ppVVar5 = ScratchAllocator::allocate_n<VkSampler_T*>(&this->allocator,(ulong)SVar3);
  sampler_hash = (uint64_t)
                 rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::Begin(samplers);
  ret = ppVVar5;
  do {
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(samplers);
    if ((ConstValueIterator)sampler_hash == pGVar6) {
      *out_sampler = ppVVar5;
      this_local._7_1_ = 1;
LAB_0011012b:
      return (bool)(this_local._7_1_ & 1);
    }
    str = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)sampler_hash);
    sampler_itr.super__Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false>.
    _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false>)
             string_to_uint64(str);
    if (sampler_itr.super__Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false>.
        _M_cur != (__node_type *)0x0) {
      local_60._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_VkSampler_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>_>
           ::find(&this->replayed_samplers,(key_type *)&sampler_itr);
      external_state_size =
           (size_t)std::
                   end<std::unordered_map<unsigned_long,VkSampler_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkSampler_T*>>>>
                             (&this->replayed_samplers);
      bVar2 = std::__detail::operator==
                        (&local_60,
                         (_Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false>
                          *)&external_state_size);
      if (bVar2) {
        external_state.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((resolver == (DatabaseInterface *)0x0) ||
           (uVar4 = (*resolver->_vptr_DatabaseInterface[3])
                              (resolver,1,
                               sampler_itr.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false>
                               ._M_cur,&external_state.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0),
           __n = external_state.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage, (uVar4 & 1) == 0)) {
          log_missing_resource
                    ("Immutable sampler",
                     (Hash)sampler_itr.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false>
                           ._M_cur);
          this_local._7_1_ = 0;
          goto LAB_0011012b;
        }
        std::allocator<unsigned_char>::allocator(&local_89);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,(size_type)__n,
                   &local_89);
        std::allocator<unsigned_char>::~allocator(&local_89);
        iVar1 = sampler_itr;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
        uVar4 = (*resolver->_vptr_DatabaseInterface[3])
                          (resolver,1,
                           iVar1.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false>
                           ._M_cur,&external_state.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((uVar4 & 1) == 0) {
          log_missing_resource
                    ("Immutable sampler",
                     (Hash)sampler_itr.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false>
                           ._M_cur);
          this_local._7_1_ = 0;
          local_90 = 1;
        }
        else {
          buffer_ = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
          total_size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88)
          ;
          bVar2 = parse(this,iface,resolver,buffer_,total_size);
          if (bVar2) {
            (*iface->_vptr_StateCreatorInterface[0x10])();
            local_98._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_long,_VkSampler_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>_>
                 ::find(&this->replayed_samplers,(key_type *)&sampler_itr);
            local_90 = 0;
            local_60._M_cur = local_98._M_cur;
          }
          else {
            this_local._7_1_ = 0;
            local_90 = 1;
          }
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
        if (local_90 != 0) goto LAB_0011012b;
      }
      else {
        (*iface->_vptr_StateCreatorInterface[0x10])();
      }
      local_a0._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_VkSampler_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>_>
           ::end(&this->replayed_samplers);
      bVar2 = std::__detail::operator==(&local_60,&local_a0);
      if (bVar2) {
        log_missing_resource
                  ("Immutable sampler",
                   (Hash)sampler_itr.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false>
                         ._M_cur);
        this_local._7_1_ = 0;
        goto LAB_0011012b;
      }
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_VkSampler_T_*>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_unsigned_long,_VkSampler_T_*>,_false,_false>
                           *)&local_60);
      if (ppVar7->second == (VkSampler_T *)0x0) {
        log_invalid_resource
                  ("Immutable sampler",
                   (Hash)sampler_itr.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false>
                         ._M_cur);
        this_local._7_1_ = 0;
        goto LAB_0011012b;
      }
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_VkSampler_T_*>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_unsigned_long,_VkSampler_T_*>,_false,_false>
                           *)&local_60);
      *ret = ppVar7->second;
    }
    sampler_hash = sampler_hash + 0x10;
    ret = ret + 1;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_immutable_samplers(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                   const Value &samplers, const VkSampler **out_sampler)
{
	auto *samps = allocator.allocate_n<VkSampler>(samplers.Size());
	auto *ret = samps;
	for (auto itr = samplers.Begin(); itr != samplers.End(); ++itr, samps++)
	{
		auto sampler_hash = string_to_uint64(itr->GetString());
		if (sampler_hash > 0)
		{
			auto sampler_itr = replayed_samplers.find(sampler_hash);
			if (sampler_itr == end(replayed_samplers))
			{
				size_t external_state_size = 0;
				if (!resolver || !resolver->read_entry(RESOURCE_SAMPLER, sampler_hash,
				                                       &external_state_size, nullptr,
				                                       PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Immutable sampler", sampler_hash);
					return false;
				}

				vector<uint8_t> external_state(external_state_size);

				if (!resolver->read_entry(RESOURCE_SAMPLER, sampler_hash,
				                          &external_state_size, external_state.data(),
				                          PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Immutable sampler", sampler_hash);
					return false;
				}

				if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
					return false;

				iface.sync_samplers();
				sampler_itr = replayed_samplers.find(sampler_hash);
			}
			else
				iface.sync_samplers();

			if (sampler_itr == replayed_samplers.end())
			{
				log_missing_resource("Immutable sampler", sampler_hash);
				return false;
			}
			else if (sampler_itr->second == VK_NULL_HANDLE)
			{
				log_invalid_resource("Immutable sampler", sampler_hash);
				return false;
			}

			*samps = sampler_itr->second;
		}
	}

	*out_sampler = ret;
	return true;
}